

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O0

int lj_carith_op(lua_State *L,MMS mm)

{
  int iVar1;
  lua_State *L_00;
  MMS in_ESI;
  TValue *in_RDI;
  CDArith ca;
  CTState *cts;
  CTState *cts_1;
  undefined4 in_stack_ffffffffffffffb8;
  MMS in_stack_ffffffffffffffbc;
  TValue *cts_00;
  lua_State *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffe0;
  MMS mm_00;
  CDArith *in_stack_ffffffffffffffe8;
  CTState *in_stack_fffffffffffffff0;
  lua_State *in_stack_fffffffffffffff8;
  
  mm_00 = (MMS)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  L_00 = (lua_State *)(ulong)*(uint *)((ulong)in_RDI[1].u32.lo + 0x194);
  L_00->base = in_RDI;
  cts_00 = in_RDI;
  iVar1 = carith_checkarg(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                          in_stack_ffffffffffffffe8);
  if ((((iVar1 == 0) || (in_ESI == MM_FAST)) || (in_ESI == MM_concat)) ||
     ((iVar1 = carith_int64(in_stack_ffffffffffffffd0,(CTState *)&cts_00->field_2,(CDArith *)L_00,
                            in_stack_ffffffffffffffbc), iVar1 == 0 &&
      (iVar1 = carith_ptr(L_00,(CTState *)
                               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          (CDArith *)&in_RDI->field_2,in_ESI), iVar1 == 0)))) {
    iVar1 = lj_carith_meta(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                           in_stack_ffffffffffffffe8,mm_00);
  }
  else {
    *(undefined8 *)((ulong)in_RDI[1].u32.lo + 0x120) =
         *(undefined8 *)&((CType *)in_RDI[3].u64)[-1].sib;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int lj_carith_op(lua_State *L, MMS mm)
{
  CTState *cts = ctype_cts(L);
  CDArith ca;
  if (carith_checkarg(L, cts, &ca) && mm != MM_len && mm != MM_concat) {
    if (carith_int64(L, cts, &ca, mm) || carith_ptr(L, cts, &ca, mm)) {
      copyTV(L, &G(L)->tmptv2, L->top-1);  /* Remember for trace recorder. */
      return 1;
    }
  }
  return lj_carith_meta(L, cts, &ca, mm);
}